

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O0

string * __thiscall
absl::time_internal::cctz::FixedOffsetToAbbr_abi_cxx11_
          (string *__return_storage_ptr__,cctz *this,seconds *offset)

{
  size_type sVar1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  size_t prefix_len;
  seconds *offset_local;
  string *abbr;
  
  FixedOffsetToName_abi_cxx11_(__return_storage_ptr__,this,offset);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (__return_storage_ptr__);
  if (sVar1 == 0x12) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,6);
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,3);
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if ((*pvVar2 == '0') &&
       (pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), *pvVar2 == '0')) {
      std::__cxx11::string::erase((ulong)__return_storage_ptr__,5);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if ((*(char *)&(this_00->_M_dataplus)._M_p == '0') &&
         (pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](this_00,in_stack_ffffffffffffff98), *pvVar2 == '0')) {
        std::__cxx11::string::erase((ulong)__return_storage_ptr__,3);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FixedOffsetToAbbr(const seconds& offset) {
  std::string abbr = FixedOffsetToName(offset);
  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  if (abbr.size() == prefix_len + 9) {         // <prefix>+99:99:99
    abbr.erase(0, prefix_len);                 // +99:99:99
    abbr.erase(6, 1);                          // +99:9999
    abbr.erase(3, 1);                          // +999999
    if (abbr[5] == '0' && abbr[6] == '0') {    // +999900
      abbr.erase(5, 2);                        // +9999
      if (abbr[3] == '0' && abbr[4] == '0') {  // +9900
        abbr.erase(3, 2);                      // +99
      }
    }
  }
  return abbr;
}